

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O0

uint AutoChooseFilterStrategy
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *image,uint w,uint h,
               State *inputstate,bool bit16,bool keep_colortype,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *origfile,int numstrategies,
               ZopfliPNGFilterStrategy *strategies,bool *enable)

{
  size_type sVar1;
  byte in_R8B;
  byte in_R9B;
  int in_stack_00000010;
  long in_stack_00000020;
  int i_1;
  uint error;
  int i;
  int windowsize;
  int bestfilter;
  size_t bestsize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  undefined1 in_stack_00000735;
  undefined1 in_stack_00000736;
  undefined1 in_stack_00000737;
  State *in_stack_00000738;
  uint in_stack_00000740;
  uint in_stack_00000744;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000748;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000760;
  ZopfliPNGFilterStrategy in_stack_00000768;
  int in_stack_00000778;
  ZopfliPNGOptions *in_stack_00000780;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000788;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_7c;
  int local_64;
  undefined4 local_60;
  int local_5c;
  ulong local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  byte local_32;
  byte local_31;
  uint local_14;
  
  local_31 = in_R8B & 1;
  local_32 = in_R9B & 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x120d85);
  local_58 = 0;
  local_5c = 0;
  local_60 = 0x2000;
  for (local_64 = 0; local_64 < in_stack_00000010; local_64 = local_64 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x120dc4);
    in_stack_ffffffffffffff50 = local_60;
    local_14 = TryOptimize(in_stack_00000748,in_stack_00000744,in_stack_00000740,in_stack_00000738,
                           (bool)in_stack_00000737,(bool)in_stack_00000736,in_stack_00000760,
                           in_stack_00000768,(bool)in_stack_00000735,in_stack_00000778,
                           in_stack_00000780,in_stack_00000788);
    if (local_14 != 0) goto LAB_00120f1d;
    if ((local_58 == 0) ||
       (sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_50),
       sVar1 < local_58)) {
      local_58 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_50);
      local_5c = local_64;
    }
  }
  for (local_7c = 0; local_7c < in_stack_00000010; local_7c = local_7c + 1) {
    *(bool *)(in_stack_00000020 + local_7c) = local_7c == local_5c;
  }
  local_14 = 0;
LAB_00120f1d:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return local_14;
}

Assistant:

unsigned AutoChooseFilterStrategy(const std::vector<unsigned char>& image,
                                  unsigned w, unsigned h,
                                  const lodepng::State& inputstate,
                                  bool bit16, bool keep_colortype,
                                  const std::vector<unsigned char>& origfile,
                                  int numstrategies,
                                  ZopfliPNGFilterStrategy* strategies,
                                  bool* enable) {
  std::vector<unsigned char> out;
  size_t bestsize = 0;
  int bestfilter = 0;

  // A large window size should still be used to do the quick compression to
  // try out filter strategies: which filter strategy is the best depends
  // largely on the window size, the closer to the actual used window size the
  // better.
  int windowsize = 8192;

  for (int i = 0; i < numstrategies; i++) {
    out.clear();
    unsigned error = TryOptimize(image, w, h, inputstate, bit16, keep_colortype,
                                 origfile, strategies[i], false, windowsize, 0,
                                 &out);
    if (error) return error;
    if (bestsize == 0 || out.size() < bestsize) {
      bestsize = out.size();
      bestfilter = i;
    }
  }

  for (int i = 0; i < numstrategies; i++) {
    enable[i] = (i == bestfilter);
  }

  return 0;  /* OK */
}